

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeC.cpp
# Opt level: O1

longlong SoapySDR_ticksToTimeNs(longlong ticks,double rate)

{
  longlong lVar1;
  long lVar2;
  
  lVar2 = (long)rate;
  lVar1 = llround((((double)(ticks % lVar2) - (rate - (double)lVar2) * (double)(ticks / lVar2)) *
                  1000000000.0) / rate);
  return lVar1 + (ticks / lVar2) * 1000000000;
}

Assistant:

long long SoapySDR_ticksToTimeNs(const long long ticks, const double rate)
{
    const long long ratell = (long long)(rate);
    const long long full = (long long)(ticks/ratell);
    const long long err = ticks - (full*ratell);
    const double part = full*(rate - ratell);
    const double frac = ((err - part)*1000000000)/rate;
    return (full*1000000000) + llround(frac);
}